

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS
ref_cell_part_cell_node(REF_CELL ref_cell,REF_NODE ref_node,REF_INT cell,REF_INT *cell_node)

{
  long local_58;
  REF_GLOB local_50;
  int local_48;
  int local_44;
  REF_INT smallest_global_node;
  REF_INT node;
  REF_GLOB smallest_global;
  REF_GLOB global;
  REF_INT *cell_node_local;
  REF_INT cell_local;
  REF_NODE ref_node_local;
  REF_CELL ref_cell_local;
  
  *cell_node = -1;
  if ((cell < 0) || (ref_cell->max < cell)) {
    ref_cell_local._4_4_ = 3;
  }
  else if (ref_cell->c2n[ref_cell->size_per * cell] == -1) {
    ref_cell_local._4_4_ = 3;
  }
  else {
    if (((ref_cell->c2n[ref_cell->size_per * cell] < 0) ||
        (ref_node->max <= ref_cell->c2n[ref_cell->size_per * cell])) ||
       (ref_node->global[ref_cell->c2n[ref_cell->size_per * cell]] < 0)) {
      local_50 = -1;
    }
    else {
      local_50 = ref_node->global[ref_cell->c2n[ref_cell->size_per * cell]];
    }
    _smallest_global_node = local_50;
    local_48 = 0;
    for (local_44 = 1; local_44 < ref_cell->node_per; local_44 = local_44 + 1) {
      if (((ref_cell->c2n[local_44 + ref_cell->size_per * cell] < 0) ||
          (ref_node->max <= ref_cell->c2n[local_44 + ref_cell->size_per * cell])) ||
         (ref_node->global[ref_cell->c2n[local_44 + ref_cell->size_per * cell]] < 0)) {
        local_58 = -1;
      }
      else {
        local_58 = ref_node->global[ref_cell->c2n[local_44 + ref_cell->size_per * cell]];
      }
      if (local_58 < _smallest_global_node) {
        _smallest_global_node = local_58;
        local_48 = local_44;
      }
    }
    if (local_48 == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x38a,
             "ref_cell_part_cell_node","node is empty?");
      ref_cell_local._4_4_ = 1;
    }
    else {
      *cell_node = local_48;
      ref_cell_local._4_4_ = 0;
    }
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_part_cell_node(REF_CELL ref_cell, REF_NODE ref_node,
                                           REF_INT cell, REF_INT *cell_node) {
  REF_GLOB global, smallest_global;
  REF_INT node, smallest_global_node;
  *cell_node = REF_EMPTY;
  if (cell < 0 || cell > ref_cell_max(ref_cell)) return REF_INVALID;
  if (REF_EMPTY == ref_cell_c2n(ref_cell, 0, cell)) return REF_INVALID;
  /* set first node as smallest */
  node = 0;
  global = ref_node_global(ref_node, ref_cell_c2n(ref_cell, node, cell));
  smallest_global = global;
  smallest_global_node = node;
  /* search other nodes for smaller global */
  for (node = 1; node < ref_cell_node_per(ref_cell); node++) {
    global = ref_node_global(ref_node, ref_cell_c2n(ref_cell, node, cell));
    if (global < smallest_global) {
      smallest_global = global;
      smallest_global_node = node;
    }
  }
  RUS(REF_EMPTY, smallest_global_node, "node is empty?");
  *cell_node = smallest_global_node;
  return REF_SUCCESS;
}